

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollHereY(float center_y_ratio)

{
  ImGuiWindow *window_00;
  float fVar1;
  float fVar2;
  float target_pos_y;
  float spacing_y;
  ImGuiWindow *window;
  ImGuiContext *g;
  float center_y_ratio_local;
  
  window_00 = GImGui->CurrentWindow;
  fVar2 = (GImGui->Style).ItemSpacing.y;
  fVar1 = ImLerp<float>((window_00->DC).CursorPosPrevLine.y - fVar2,
                        (window_00->DC).CursorPosPrevLine.y + (window_00->DC).PrevLineSize.y + fVar2
                        ,center_y_ratio);
  SetScrollFromPosY(window_00,fVar1 - (window_00->Pos).y,center_y_ratio);
  fVar2 = ImMax<float>(0.0,(window_00->WindowPadding).y - fVar2);
  (window_00->ScrollTargetEdgeSnapDist).y = fVar2;
  return;
}

Assistant:

void ImGui::SetScrollHereY(float center_y_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_y = g.Style.ItemSpacing.y;
    float target_pos_y = ImLerp(window->DC.CursorPosPrevLine.y - spacing_y, window->DC.CursorPosPrevLine.y + window->DC.PrevLineSize.y + spacing_y, center_y_ratio);
    SetScrollFromPosY(window, target_pos_y - window->Pos.y, center_y_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.y = ImMax(0.0f, window->WindowPadding.y - spacing_y);
}